

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_signature_parse_der
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  int iVar1;
  uchar *sigend;
  secp256k1_scalar s;
  secp256k1_scalar r;
  size_t rlen;
  uchar *local_28;
  secp256k1_scalar local_20;
  secp256k1_scalar local_1c;
  size_t local_18;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_parse_der_cold_3();
  }
  else if (sig != (secp256k1_ecdsa_signature *)0x0) {
    if (input == (uchar *)0x0) {
      secp256k1_ecdsa_signature_parse_der_cold_1();
      return 0;
    }
    if ((inputlen != 0) && (local_28 = input + 1, *input == '0')) {
      sigend = input + inputlen;
      iVar1 = secp256k1_der_read_len(&local_18,&local_28,sigend);
      if (((iVar1 != 0) &&
          (((local_18 == (long)sigend - (long)local_28 &&
            (iVar1 = secp256k1_der_parse_integer(&local_1c,&local_28,sigend), iVar1 != 0)) &&
           (iVar1 = secp256k1_der_parse_integer(&local_20,&local_28,sigend), iVar1 != 0)))) &&
         (local_28 == sigend)) {
        secp256k1_ecdsa_signature_save(sig,&local_1c,&local_20);
        return 1;
      }
    }
    sig->data[0x30] = '\0';
    sig->data[0x31] = '\0';
    sig->data[0x32] = '\0';
    sig->data[0x33] = '\0';
    sig->data[0x34] = '\0';
    sig->data[0x35] = '\0';
    sig->data[0x36] = '\0';
    sig->data[0x37] = '\0';
    sig->data[0x38] = '\0';
    sig->data[0x39] = '\0';
    sig->data[0x3a] = '\0';
    sig->data[0x3b] = '\0';
    sig->data[0x3c] = '\0';
    sig->data[0x3d] = '\0';
    sig->data[0x3e] = '\0';
    sig->data[0x3f] = '\0';
    sig->data[0x20] = '\0';
    sig->data[0x21] = '\0';
    sig->data[0x22] = '\0';
    sig->data[0x23] = '\0';
    sig->data[0x24] = '\0';
    sig->data[0x25] = '\0';
    sig->data[0x26] = '\0';
    sig->data[0x27] = '\0';
    sig->data[0x28] = '\0';
    sig->data[0x29] = '\0';
    sig->data[0x2a] = '\0';
    sig->data[0x2b] = '\0';
    sig->data[0x2c] = '\0';
    sig->data[0x2d] = '\0';
    sig->data[0x2e] = '\0';
    sig->data[0x2f] = '\0';
    sig->data[0x10] = '\0';
    sig->data[0x11] = '\0';
    sig->data[0x12] = '\0';
    sig->data[0x13] = '\0';
    sig->data[0x14] = '\0';
    sig->data[0x15] = '\0';
    sig->data[0x16] = '\0';
    sig->data[0x17] = '\0';
    sig->data[0x18] = '\0';
    sig->data[0x19] = '\0';
    sig->data[0x1a] = '\0';
    sig->data[0x1b] = '\0';
    sig->data[0x1c] = '\0';
    sig->data[0x1d] = '\0';
    sig->data[0x1e] = '\0';
    sig->data[0x1f] = '\0';
    sig->data[0] = '\0';
    sig->data[1] = '\0';
    sig->data[2] = '\0';
    sig->data[3] = '\0';
    sig->data[4] = '\0';
    sig->data[5] = '\0';
    sig->data[6] = '\0';
    sig->data[7] = '\0';
    sig->data[8] = '\0';
    sig->data[9] = '\0';
    sig->data[10] = '\0';
    sig->data[0xb] = '\0';
    sig->data[0xc] = '\0';
    sig->data[0xd] = '\0';
    sig->data[0xe] = '\0';
    sig->data[0xf] = '\0';
    return 0;
  }
  secp256k1_ecdsa_signature_parse_der_cold_2();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_parse_der(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input != NULL);

    if (secp256k1_ecdsa_sig_parse(&r, &s, input, inputlen)) {
        secp256k1_ecdsa_signature_save(sig, &r, &s);
        return 1;
    } else {
        memset(sig, 0, sizeof(*sig));
        return 0;
    }
}